

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::ReattemptInitialBroadcast
          (PeerManagerImpl *this,CScheduler *scheduler)

{
  long lVar1;
  Function f;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  CTransactionRef tx;
  ChaCha20 local_e0;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTxMemPool::GetUnbroadcastTxs(&unbroadcast_txids,this->m_mempool);
  for (p_Var2 = unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &unbroadcast_txids._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    CTxMemPool::get((CTxMemPool *)&tx,(uint256 *)this->m_mempool);
    if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      CTxMemPool::RemoveUnbroadcastTx(this->m_mempool,(uint256 *)(p_Var2 + 1),true);
    }
    else {
      RelayTransaction(this,(uint256 *)(p_Var2 + 1),
                       &((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_witness_hash).m_wrapped);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  FastRandomContext::FastRandomContext((FastRandomContext *)&tx,false);
  RandomMixin<FastRandomContext>::randrange<long>((RandomMixin<FastRandomContext> *)&tx,300000);
  ChaCha20::~ChaCha20(&local_e0);
  f.super__Function_base._M_functor._8_8_ = this;
  f.super__Function_base._M_functor._M_unused._M_object = scheduler;
  f.super__Function_base._M_manager = (_Manager_type)scheduler;
  f._M_invoker = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:1755:31)>
                 ::_M_manager;
  CScheduler::scheduleFromNow(scheduler,f,(milliseconds)&stack0xfffffffffffffef0);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffef0);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&unbroadcast_txids._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ReattemptInitialBroadcast(CScheduler& scheduler)
{
    std::set<uint256> unbroadcast_txids = m_mempool.GetUnbroadcastTxs();

    for (const auto& txid : unbroadcast_txids) {
        CTransactionRef tx = m_mempool.get(txid);

        if (tx != nullptr) {
            RelayTransaction(txid, tx->GetWitnessHash());
        } else {
            m_mempool.RemoveUnbroadcastTx(txid, true);
        }
    }

    // Schedule next run for 10-15 minutes in the future.
    // We add randomness on every cycle to avoid the possibility of P2P fingerprinting.
    const auto delta = 10min + FastRandomContext().randrange<std::chrono::milliseconds>(5min);
    scheduler.scheduleFromNow([&] { ReattemptInitialBroadcast(scheduler); }, delta);
}